

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O2

void __thiscall Gc_Nothing_Test::TestBody(Gc_Nothing_Test *this)

{
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *this_00;
  TypedExpectation<void_(const_int_&)> *this_01;
  thread thread;
  MockSpec<void_(const_int_&)> local_178;
  test_watch_thread gc;
  
  anon_unknown.dwarf_4c53f::test_watch_thread::test_watch_thread(&gc);
  thread._M_id._M_thread = (id)&PTR__MatcherBase_0018a298;
  anon_unknown.dwarf_4c53f::test_watch_thread::gmock_spawn
            ((MockSpec<int_(std::initializer_list<const_char_*>)> *)&local_178,&gc,
             (Matcher<std::initializer_list<const_char_*>_> *)&thread);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
            InternalExpectedAt((MockSpec<int_(std::initializer_list<const_char_*>)> *)&local_178,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                               ,0x98,"gc","spawn (_)");
  testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::Times(this_00,0);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&local_178.matchers_);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&thread);
  thread._M_id._M_thread = (id)&PTR__MatcherBase_0018a3f8;
  anon_unknown.dwarf_4c53f::test_watch_thread::gmock_kill
            (&local_178,&gc,(Matcher<const_int_&> *)&thread);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                      (&local_178,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                       ,0x99,"gc","kill (_)");
  testing::internal::TypedExpectation<void_(const_int_&)>::Times(this_01,0);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)&local_178.matchers_);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&thread);
  thread._M_id._M_thread = (id)0;
  local_178.function_mocker_ = (FunctionMocker<void_(const_int_&)> *)operator_new(0x10);
  ((local_178.function_mocker_)->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR___State_00189fd8;
  ((local_178.function_mocker_)->super_UntypedFunctionMockerBase).mock_obj_ = &gc;
  std::thread::_M_start_thread(&thread,&local_178,0);
  if (local_178.function_mocker_ != (FunctionMocker<void_(const_int_&)> *)0x0) {
    (*((local_178.function_mocker_)->super_UntypedFunctionMockerBase).
      _vptr_UntypedFunctionMockerBase[1])();
  }
  pstore::broker::gc_watch_thread::stop(&gc.super_gc_watch_thread,-1);
  std::thread::join();
  std::thread::~thread(&thread);
  anon_unknown.dwarf_4c53f::test_watch_thread::~test_watch_thread(&gc);
  return;
}

Assistant:

TEST_F (Gc, Nothing) {
    test_watch_thread gc;
    EXPECT_CALL (gc, spawn (_)).Times (0);
    EXPECT_CALL (gc, kill (_)).Times (0);

    std::thread thread{[&gc] () { gc.watcher (); }};
    gc.stop ();
    thread.join ();
}